

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::checkPowerOf10(string *unit_string)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  out_of_range *anon_var_0;
  int power;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> powerstr;
  size_type fndP;
  size_t *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  string *string;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  size_type in_stack_ffffffffffffffc8;
  _Alloc_hider in_stack_ffffffffffffffd0;
  ulong local_10;
  
  local_10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  (char *)in_stack_ffffffffffffffb8,
                  CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  do {
    if (local_10 == 0xffffffffffffffff) {
      return;
    }
    sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            size(in_RDI);
    if (local_10 + 3 < sVar2) {
      pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            (size_type)in_stack_ffffffffffffff98);
      bVar1 = isNumericalStartCharacter(*pvVar3);
      if (bVar1) {
        if (local_10 != 0) {
          pvVar3 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              (size_type)in_stack_ffffffffffffff98);
          bVar1 = isNumericalCharacter(*pvVar3);
          if ((bVar1) &&
             (((local_10 < 2 ||
               (pvVar3 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                                    ,(size_type)in_stack_ffffffffffffff98), *pvVar3 != '.')) ||
              ((pvVar3 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                                    ,(size_type)in_stack_ffffffffffffff98), '/' < *pvVar3 &&
               (pvVar3 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                                    ,(size_type)in_stack_ffffffffffffff98), *pvVar3 < ':'))))))
          goto LAB_007a2dc8;
        }
        string = (string *)&stack0xffffffffffffffd0;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (in_stack_ffffffffffffffb8,
                   CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),(size_type)string);
        in_stack_ffffffffffffffb7 = looksLikeInteger(string);
        if ((bool)in_stack_ffffffffffffffb7) {
          in_stack_ffffffffffffffa4 =
               std::__cxx11::stoi((string *)
                                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                  in_stack_ffffffffffffff98,0);
          lVar4 = (long)in_stack_ffffffffffffffa4;
          if (lVar4 < 1) {
            lVar4 = -lVar4;
          }
          in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffa4;
          if (lVar4 < 0x27) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffffd0._M_p,in_stack_ffffffffffffffc8,
                    CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffa4),
                    (char *)in_stack_ffffffffffffffb8);
          }
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      }
    }
LAB_007a2dc8:
    local_10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      (char *)in_stack_ffffffffffffffb8,
                      CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  } while( true );
}

Assistant:

static void checkPowerOf10(std::string& unit_string)
{
    auto fndP = unit_string.find("10*");
    while (fndP != std::string::npos) {
        if (unit_string.size() > fndP + 3 &&
            isNumericalStartCharacter(unit_string[fndP + 3])) {
            if (fndP == 0 || !isNumericalCharacter(unit_string[fndP - 1]) ||
                (fndP >= 2 && unit_string[fndP - 1] == '.' &&
                 (unit_string[fndP - 2] < '0' ||
                  unit_string[fndP - 2] > '9'))) {
                auto powerstr = unit_string.substr(fndP + 3);
                if (looksLikeInteger(powerstr)) {
                    try {
                        int power = std::stoi(powerstr);
                        if (std::labs(power) <= 38) {
                            unit_string.replace(fndP, 3, "1e");
                        }
                    }
                    catch (const std::out_of_range&) {
                        // if it is a really big number we obviously skip it
                    }
                }
            }
        }
        fndP = unit_string.find("10*", fndP + 3);
    }
}